

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

void __thiscall helics::apps::Recorder::generateInterfaces(Recorder *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->subkeys)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    if (*(int *)&p_Var1[1]._M_left == -1) {
      addSubscription(this,*(string_view *)(p_Var1 + 1));
    }
  }
  for (p_Var1 = (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->eptNames)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    if (*(int *)&p_Var1[1]._M_left == -1) {
      addEndpoint(this,*(string_view *)(p_Var1 + 1));
    }
  }
  loadCaptureInterfaces(this);
  return;
}

Assistant:

void Recorder::generateInterfaces()
{
    for (auto& tag : subkeys) {
        if (tag.second == -1) {
            addSubscription(tag.first);
        }
    }
    for (auto& ept : eptNames) {
        if (ept.second == -1) {
            addEndpoint(ept.first);
        }
    }
    loadCaptureInterfaces();
}